

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

JSON * chaiscript::json::JSONParser::parse_next
                 (JSON *__return_storage_ptr__,string *str,size_t *offset)

{
  char __rhs;
  const_reference pvVar1;
  runtime_error *this;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  consume_ws(str,offset);
  pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     (str,*offset);
  __rhs = *pvVar1;
  if (__rhs == '\"') {
    parse_string(__return_storage_ptr__,str,offset);
  }
  else if (__rhs == '{') {
    parse_object(__return_storage_ptr__,str,offset);
  }
  else {
    if (__rhs != 'f') {
      if (__rhs == 'n') {
        parse_null(__return_storage_ptr__,str,offset);
        return __return_storage_ptr__;
      }
      if (__rhs != 't') {
        if (__rhs == '[') {
          parse_array(__return_storage_ptr__,str,offset);
          return __return_storage_ptr__;
        }
        if (__rhs == '-' || (byte)(__rhs - 0x30U) < 10) {
          parse_number(__return_storage_ptr__,str,offset);
          return __return_storage_ptr__;
        }
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"JSON ERROR: Parse: Unexpected starting character \'",
                   &local_89);
        std::operator+(&local_68,&local_88,__rhs);
        std::operator+(&local_48,&local_68,"\'");
        std::runtime_error::runtime_error(this,(string *)&local_48);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    parse_bool(__return_storage_ptr__,str,offset);
  }
  return __return_storage_ptr__;
}

Assistant:

static JSON parse_next(const std::string &str, size_t &offset) {
      char value;
      consume_ws(str, offset);
      value = str.at(offset);
      switch (value) {
        case '[':
          return parse_array(str, offset);
        case '{':
          return parse_object(str, offset);
        case '\"':
          return parse_string(str, offset);
        case 't':
        case 'f':
          return parse_bool(str, offset);
        case 'n':
          return parse_null(str, offset);
        default:
          if ((value <= '9' && value >= '0') || value == '-') {
            return parse_number(str, offset);
          }
      }
      throw std::runtime_error(std::string("JSON ERROR: Parse: Unexpected starting character '") + value + "'");
    }